

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_panel_type type;
  int iVar7;
  int iVar8;
  nk_panel *pnVar9;
  float *pfVar10;
  nk_vec2 nVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float local_48;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46f7,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  pnVar9 = ctx->current->layout;
  if (pnVar9 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46f8,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (bounds == (nk_rect *)0x0) {
    __assert_fail("bounds",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x46ff,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar16 = (ctx->style).window.spacing.x;
  fVar14 = (ctx->style).window.spacing.y;
  type = pnVar9->type;
  nVar11 = nk_panel_get_padding(&ctx->style,type);
  fVar17 = (pnVar9->bounds).w;
  iVar7 = (pnVar9->row).columns;
  fVar13 = nk_layout_row_calculate_usable_space(&ctx->style,type,fVar17,iVar7);
  iVar12 = (int)win;
  switch((pnVar9->row).type) {
  case NK_LAYOUT_DYNAMIC_FIXED:
    if (fVar13 <= 1.0) {
      fVar13 = 1.0;
    }
    fVar20 = (float)(pnVar9->row).index;
    fVar15 = (fVar13 / (float)iVar7) * fVar20;
    fVar17 = (fVar15 - (float)(int)fVar15) + fVar13 / (float)iVar7;
    fVar20 = fVar16 * fVar20;
    break;
  case NK_LAYOUT_DYNAMIC_ROW:
    fVar19 = (pnVar9->row).item_width;
    fVar15 = (pnVar9->row).item_offset;
    fVar13 = fVar13 * fVar19;
    fVar17 = (fVar15 - (float)(int)fVar15) + fVar13;
    fVar20 = 0.0;
    if (iVar12 != 0) {
      (pnVar9->row).item_offset = fVar16 + fVar13 + fVar15;
      (pnVar9->row).filled = (pnVar9->row).filled + fVar19;
      (pnVar9->row).index = 0;
    }
    break;
  case NK_LAYOUT_DYNAMIC_FREE:
    uVar1 = pnVar9->at_x;
    uVar4 = pnVar9->at_y;
    uVar2 = (pnVar9->row).item.x;
    uVar5 = (pnVar9->row).item.y;
    fVar16 = (pnVar9->row).height;
    auVar18._4_4_ = 0;
    auVar18._0_4_ = *pnVar9->offset_x;
    auVar18._8_4_ = *pnVar9->offset_y;
    auVar18._12_4_ = 0;
    fVar14 = ((float)uVar2 * fVar17 + (float)uVar1) -
             (float)(SUB168(auVar18 | _DAT_00144250,0) - (double)DAT_00144250);
    fVar13 = ((float)uVar5 * fVar16 + (float)uVar4) -
             (float)(SUB168(auVar18 | _DAT_00144250,8) - DAT_00144250._8_8_);
    bounds->x = fVar14;
    bounds->y = fVar13;
    uVar3 = (pnVar9->row).item.w;
    uVar6 = (pnVar9->row).item.h;
    bounds->w = (float)uVar3 * fVar17 + (fVar14 - (float)(int)fVar14);
    bounds->h = (float)uVar6 * fVar16 + (fVar13 - (float)(int)fVar13);
    return;
  case NK_LAYOUT_DYNAMIC:
    pfVar10 = (pnVar9->row).ratio;
    if (pfVar10 == (float *)0x0) {
      __assert_fail("layout->row.ratio",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x472a,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    iVar7 = (pnVar9->row).index;
    fVar19 = pfVar10[iVar7];
    if (fVar19 < 0.0) {
      fVar19 = (pnVar9->row).item_width;
    }
    fVar20 = fVar16 * (float)iVar7;
    fVar15 = (pnVar9->row).item_offset;
    fVar17 = (fVar15 - (float)(int)fVar15) + fVar13 * fVar19;
    if (iVar12 != 0) {
      (pnVar9->row).item_offset = fVar13 * fVar19 + fVar15;
      (pnVar9->row).filled = (pnVar9->row).filled + fVar19;
    }
    break;
  case NK_LAYOUT_STATIC_FIXED:
    fVar17 = (pnVar9->row).item_width;
    fVar20 = (float)(pnVar9->row).index;
    fVar15 = fVar17 * fVar20;
    fVar20 = fVar16 * fVar20;
    break;
  case NK_LAYOUT_STATIC_ROW:
    iVar7 = (pnVar9->row).index;
    fVar17 = (pnVar9->row).item_width;
    fVar15 = (pnVar9->row).item_offset;
    goto LAB_0012fd03;
  case NK_LAYOUT_STATIC_FREE:
    fVar16 = (pnVar9->row).item.w;
    fVar14 = pnVar9->at_x + (pnVar9->row).item.x;
    bounds->w = fVar16;
    if ((iVar12 != 0) &&
       (fVar16 = fVar16 + fVar14, pnVar9->max_x <= fVar16 && fVar16 != pnVar9->max_x)) {
      pnVar9->max_x = fVar16;
    }
    bounds->x = fVar14 - (float)*pnVar9->offset_x;
    bounds->y = (pnVar9->at_y + (pnVar9->row).item.y) - (float)*pnVar9->offset_y;
    bounds->h = (pnVar9->row).item.h;
    return;
  case NK_LAYOUT_STATIC:
    iVar7 = (pnVar9->row).index;
    fVar17 = (pnVar9->row).ratio[iVar7];
    fVar15 = (pnVar9->row).item_offset;
LAB_0012fd03:
    fVar20 = fVar16 * (float)iVar7;
    if (iVar12 != 0) {
      (pnVar9->row).item_offset = fVar17 + fVar15;
    }
    break;
  case NK_LAYOUT_TEMPLATE:
    iVar8 = (pnVar9->row).index;
    if (iVar7 <= iVar8) {
      __assert_fail("layout->row.index < layout->row.columns",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x475b,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    if (0xf < iVar8) {
      __assert_fail("layout->row.index < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x475c,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    fVar15 = (pnVar9->row).item_offset;
    fVar13 = (pnVar9->row).templates[iVar8];
    fVar17 = (fVar15 - (float)(int)fVar15) + fVar13;
    fVar20 = fVar16 * (float)iVar8;
    if (iVar12 != 0) {
      (pnVar9->row).item_offset = fVar13 + fVar15;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4764,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  bounds->w = fVar17;
  bounds->h = (pnVar9->row).height - fVar14;
  bounds->y = pnVar9->at_y - (float)*pnVar9->offset_y;
  local_48 = nVar11.x;
  local_48 = fVar15 + pnVar9->at_x + fVar20 + local_48;
  if ((iVar12 != 0) &&
     (fVar17 = fVar17 + local_48, pnVar9->max_x <= fVar17 && fVar17 != pnVar9->max_x)) {
    pnVar9->max_x = fVar17;
  }
  bounds->x = local_48 - (float)*pnVar9->offset_x;
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
    struct nk_window *win, int modify)
{
    struct nk_panel *layout;
    const struct nk_style *style;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    float item_offset = 0;
    float item_width = 0;
    float item_spacing = 0;
    float panel_space = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    NK_ASSERT(bounds);

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, layout->type);
    panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                                            layout->bounds.w, layout->row.columns);

    #define NK_FRAC(x) (x - (int)x) /* will be used to remove fookin gaps */
    /* calculate the width of one item inside the current layout space */
    switch (layout->row.type) {
    case NK_LAYOUT_DYNAMIC_FIXED: {
        /* scaling fixed size widgets item width */
        float w = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
        item_offset = (float)layout->row.index * w;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_DYNAMIC_ROW: {
        /* scaling single ratio widget width */
        float w = layout->row.item_width * panel_space;
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = 0;

        if (modify) {
            layout->row.item_offset += w + spacing.x;
            layout->row.filled += layout->row.item_width;
            layout->row.index = 0;
        }
    } break;
    case NK_LAYOUT_DYNAMIC_FREE: {
        /* panel width depended free widget placing */
        bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
        bounds->y -= (float)*layout->offset_y;
        bounds->w = layout->bounds.w  * layout->row.item.w + NK_FRAC(bounds->x);
        bounds->h = layout->row.height * layout->row.item.h + NK_FRAC(bounds->y);
        return;
    }
    case NK_LAYOUT_DYNAMIC: {
        /* scaling arrays of panel width ratios for every widget */
        float ratio, w;
        NK_ASSERT(layout->row.ratio);
        ratio = (layout->row.ratio[layout->row.index] < 0) ?
            layout->row.item_width : layout->row.ratio[layout->row.index];

        w = (ratio * panel_space);
        item_spacing = (float)layout->row.index * spacing.x;
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);

        if (modify) {
            layout->row.item_offset += w;
            layout->row.filled += ratio;
        }
    } break;
    case NK_LAYOUT_STATIC_FIXED: {
        /* non-scaling fixed widgets item width */
        item_width = layout->row.item_width;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_STATIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width;
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_STATIC_FREE: {
        /* free widget placing */
        bounds->x = layout->at_x + layout->row.item.x;
        bounds->w = layout->row.item.w;
        if (((bounds->x + bounds->w) > layout->max_x) && modify)
            layout->max_x = (bounds->x + bounds->w);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + layout->row.item.y;
        bounds->y -= (float)*layout->offset_y;
        bounds->h = layout->row.item.h;
        return;
    }
    case NK_LAYOUT_STATIC: {
        /* non-scaling array of panel pixel width for every widget */
        item_spacing = (float)layout->row.index * spacing.x;
        item_width = layout->row.ratio[layout->row.index];
        item_offset = layout->row.item_offset;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_TEMPLATE: {
        /* stretchy row layout with combined dynamic/static widget width*/
        float w;
        NK_ASSERT(layout->row.index < layout->row.columns);
        NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
        w = layout->row.templates[layout->row.index];
        item_offset = layout->row.item_offset;
        item_width = w + NK_FRAC(item_offset);
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += w;
    } break;
    #undef NK_FRAC
    default: NK_ASSERT(0); break;
    };

    /* set the bounds of the newly allocated widget */
    bounds->w = item_width;
    bounds->h = layout->row.height - spacing.y;
    bounds->y = layout->at_y - (float)*layout->offset_y;
    bounds->x = layout->at_x + item_offset + item_spacing + padding.x;
    if (((bounds->x + bounds->w) > layout->max_x) && modify)
        layout->max_x = bounds->x + bounds->w;
    bounds->x -= (float)*layout->offset_x;
}